

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

void conf_serialise(BinarySink *bs,Conf *conf)

{
  int *piVar1;
  int index;
  
  piVar1 = (int *)index234(conf->tree,0);
  if (piVar1 != (int *)0x0) {
    index = 1;
    do {
      BinarySink_put_uint32(bs->binarysink_,(long)*piVar1);
      if (subkeytypes[*piVar1] == 3) {
        BinarySink_put_asciz(bs->binarysink_,*(char **)(piVar1 + 2));
      }
      else if (subkeytypes[*piVar1] == 2) {
        BinarySink_put_uint32(bs->binarysink_,(long)piVar1[2]);
      }
      switch(valuetypes[*piVar1]) {
      case 1:
        BinarySink_put_bool(bs->binarysink_,SUB41(piVar1[4],0));
        break;
      case 2:
        BinarySink_put_uint32(bs->binarysink_,(long)piVar1[4]);
        break;
      case 3:
        BinarySink_put_asciz(bs->binarysink_,*(char **)(piVar1 + 4));
        break;
      case 4:
        filename_serialise(bs,*(Filename **)(piVar1 + 4));
        break;
      case 5:
        fontspec_serialise(bs,*(FontSpec **)(piVar1 + 4));
      }
      piVar1 = (int *)index234(conf->tree,index);
      index = index + 1;
    } while (piVar1 != (int *)0x0);
  }
  BinarySink_put_uint32(bs->binarysink_,0xffffffff);
  return;
}

Assistant:

void conf_serialise(BinarySink *bs, Conf *conf)
{
    int i;
    struct conf_entry *entry;

    for (i = 0; (entry = index234(conf->tree, i)) != NULL; i++) {
        put_uint32(bs, entry->key.primary);

        switch (subkeytypes[entry->key.primary]) {
          case TYPE_INT:
            put_uint32(bs, entry->key.secondary.i);
            break;
          case TYPE_STR:
            put_asciz(bs, entry->key.secondary.s);
            break;
        }
        switch (valuetypes[entry->key.primary]) {
          case TYPE_BOOL:
            put_bool(bs, entry->value.u.boolval);
            break;
          case TYPE_INT:
            put_uint32(bs, entry->value.u.intval);
            break;
          case TYPE_STR:
            put_asciz(bs, entry->value.u.stringval);
            break;
          case TYPE_FILENAME:
            filename_serialise(bs, entry->value.u.fileval);
            break;
          case TYPE_FONT:
            fontspec_serialise(bs, entry->value.u.fontval);
            break;
        }
    }

    put_uint32(bs, 0xFFFFFFFFU);
}